

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapePiram>::ComputeVecandShape(TPZShapeData *data)

{
  int iside;
  int maxorder [3];
  TPZGenMatrix<int> shapeorders;
  TPZManVector<int,_27> permgather;
  TPZManVector<int,_10> facevector;
  TPZManVector<int,_57> VectorSides;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_57> normalsides;
  TPZManVector<int,_57> directions;
  TPZManVector<int,_57> bilinear;
  TPZManVector<int,_10> local_600;
  TPZVec<int> local_5b8;
  int local_598 [58];
  TPZVec<int> local_4b0;
  int local_490 [82];
  TPZVec<int> local_348;
  int local_328 [58];
  TPZVec<int> local_240;
  int local_220 [58];
  TPZVec<int> local_138;
  int local_118 [58];
  
  TPZVec<int>::TPZVec(&local_5b8,0);
  local_5b8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd948;
  local_5b8.fStore = local_598;
  local_5b8.fNElements = 0x39;
  local_5b8.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_138,0);
  local_138.fStore = local_118;
  local_138._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd948;
  local_138.fNElements = 0x39;
  local_138.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_240,0);
  local_240.fStore = local_220;
  local_240._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd948;
  local_240.fNElements = 0x39;
  local_240.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_348,0);
  local_348.fStore = local_328;
  local_348._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd948;
  local_348.fNElements = 0x39;
  local_348.fNAlloc = 0;
  pztopology::TPZPyramid::GetSideHDivDirections(&local_5b8,&local_240,&local_138,&local_348);
  if ((data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x6c);
  }
  pzshape::TPZShapePiram::NShapeF(&(data->fH1ConnectOrders).super_TPZVec<int>);
  local_4b0._vptr_TPZVec = (_func_int **)CONCAT44(local_4b0._vptr_TPZVec._4_4_,0x12);
  TPZManVector<int,_10>::TPZManVector(&local_600,local_5b8.fNElements,(int *)&local_4b0);
  TPZVec<int>::TPZVec(&local_4b0,0);
  local_4b0.fStore = local_490;
  local_4b0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd738;
  local_4b0.fNElements = 0x39;
  local_4b0.fNAlloc = 0;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x79);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}